

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O2

void __thiscall katherine::system_error::system_error(system_error *this,int rc)

{
  char *__s;
  allocator<char> local_31;
  string local_30;
  
  __s = strerror(rc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
  error::error(&this->super_error,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_error = &PTR__runtime_error_00105d48;
  return;
}

Assistant:

system_error(int rc) :error{std::strerror(rc)} { }